

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double find_split_full_gain<float,long_double>
                 (float *x,size_t st,size_t end,size_t *ix_arr,size_t *cols_use,size_t ncols_use,
                 bool force_cols_use,double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,
                 size_t *Xr_indptr,double *buffer_sum_left,double *buffer_sum_tot,size_t *split_ix,
                 double *split_point,bool x_uses_ix_arr)

{
  ulong *puVar1;
  double dVar2;
  char cVar3;
  size_t row_2;
  size_t __n;
  ulong *puVar4;
  size_t *psVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  size_t row_4;
  size_t sVar9;
  size_t row;
  size_t sVar10;
  ulong uVar11;
  size_t row_1;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  
  if (end < st || end - st == 0) {
    return -INFINITY;
  }
  if (((ncols_use == 0 || cols_use == (size_t *)0x0) ||
      (auVar21._8_4_ = (int)(ncols_use >> 0x20), auVar21._0_8_ = ncols_use,
      auVar21._12_4_ = 0x45300000, auVar14._8_4_ = (int)(ncols >> 0x20), auVar14._0_8_ = ncols,
      auVar14._12_4_ = 0x45300000, sVar10 = ncols_use, cVar3 = '\x01',
      0.1 <= ((auVar21._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)ncols_use) - 4503599627370496.0)) /
             ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)ncols) - 4503599627370496.0)))) &&
     (sVar10 = ncols, cVar3 = force_cols_use, force_cols_use)) {
    sVar10 = ncols_use;
  }
  __n = sVar10 << 3;
  memset(buffer_sum_tot,0,__n);
  if (Xr_indptr == (size_t *)0x0) {
    uVar11 = st;
    if (cVar3 == '\0') {
      for (; uVar11 <= end; uVar11 = uVar11 + 1) {
        xpy1(X_row_major + ix_arr[uVar11] * ncols,buffer_sum_tot,ncols);
      }
    }
    else {
      for (; uVar11 <= end; uVar11 = uVar11 + 1) {
        sVar10 = ix_arr[uVar11];
        for (sVar7 = 0; ncols_use != sVar7; sVar7 = sVar7 + 1) {
          buffer_sum_tot[sVar7] =
               X_row_major[sVar10 * ncols + cols_use[sVar7]] + buffer_sum_tot[sVar7];
        }
      }
    }
LAB_00263bdf:
    memset(buffer_sum_left,0,__n);
    if (Xr_indptr == (size_t *)0x0) {
      if (cVar3 == '\0') {
        dVar26 = -INFINITY;
        for (sVar10 = st; uVar11 = end - sVar10, sVar10 <= end && uVar11 != 0; sVar10 = sVar10 + 1)
        {
          sVar7 = ix_arr[sVar10];
          xpy1(X_row_major + sVar7 * ncols,buffer_sum_left,ncols);
          if (x_uses_ix_arr) {
            bVar12 = NAN(x[sVar7]) || NAN(x[ix_arr[sVar10 + 1]]);
            bVar13 = x[sVar7] == x[ix_arr[sVar10 + 1]];
          }
          else {
            bVar12 = NAN(x[sVar10]) || NAN(x[sVar10 + 1]);
            bVar13 = x[sVar10] == x[sVar10 + 1];
          }
          if ((!bVar13) || (bVar12)) {
            uVar6 = (sVar10 - st) + 1;
            auVar17._0_8_ =
                 ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(uVar6 & 0xffffffff | 0x4330000000000000);
            auVar17._8_8_ =
                 ((double)(uVar11 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(uVar11 & 0xffffffff | 0x4330000000000000);
            dVar18 = 0.0;
            dVar19 = 0.0;
            for (sVar7 = 0; ncols != sVar7; sVar7 = sVar7 + 1) {
              dVar2 = buffer_sum_left[sVar7];
              auVar23._8_8_ = buffer_sum_tot[sVar7] - dVar2;
              auVar23._0_8_ = dVar2;
              auVar21 = divpd(auVar23,auVar17);
              dVar18 = dVar18 + auVar21._0_8_ * dVar2;
              dVar19 = dVar19 + auVar21._8_8_ * (buffer_sum_tot[sVar7] - dVar2);
            }
            if (dVar26 < dVar19 + dVar18) {
              *split_ix = sVar10;
              dVar26 = dVar19 + dVar18;
            }
          }
        }
      }
      else {
        dVar26 = -INFINITY;
        for (sVar10 = st; uVar11 = end - sVar10, sVar10 <= end && uVar11 != 0; sVar10 = sVar10 + 1)
        {
          sVar7 = ix_arr[sVar10];
          for (sVar9 = 0; ncols_use != sVar9; sVar9 = sVar9 + 1) {
            buffer_sum_left[sVar9] =
                 X_row_major[sVar7 * ncols + cols_use[sVar9]] + buffer_sum_left[sVar9];
          }
          if (x_uses_ix_arr) {
            bVar12 = NAN(x[sVar7]) || NAN(x[ix_arr[sVar10 + 1]]);
            bVar13 = x[sVar7] == x[ix_arr[sVar10 + 1]];
          }
          else {
            bVar12 = NAN(x[sVar10]) || NAN(x[sVar10 + 1]);
            bVar13 = x[sVar10] == x[sVar10 + 1];
          }
          if ((!bVar13) || (bVar12)) {
            uVar6 = (sVar10 - st) + 1;
            auVar24._0_8_ =
                 ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(uVar6 & 0xffffffff | 0x4330000000000000);
            auVar24._8_8_ =
                 ((double)(uVar11 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
                 (double)(uVar11 & 0xffffffff | 0x4330000000000000);
            dVar18 = 0.0;
            dVar19 = 0.0;
            for (sVar7 = 0; ncols_use != sVar7; sVar7 = sVar7 + 1) {
              dVar2 = buffer_sum_left[sVar7];
              auVar25._8_8_ = buffer_sum_tot[sVar7] - dVar2;
              auVar25._0_8_ = dVar2;
              auVar21 = divpd(auVar25,auVar24);
              dVar18 = dVar18 + auVar21._0_8_ * dVar2;
              dVar19 = dVar19 + auVar21._8_8_ * (buffer_sum_tot[sVar7] - dVar2);
            }
            if (dVar26 < dVar19 + dVar18) {
              *split_ix = sVar10;
              dVar26 = dVar19 + dVar18;
            }
          }
        }
      }
      goto LAB_0026420f;
    }
  }
  else {
    uVar11 = st;
    if (cVar3 != '\0') {
      for (sVar10 = st; sVar10 <= end; sVar10 = sVar10 + 1) {
        sVar7 = Xr_indptr[ix_arr[sVar10]];
        if (sVar7 != Xr_indptr[ix_arr[sVar10] + 1]) {
          puVar1 = Xr_ind + Xr_indptr[ix_arr[sVar10] + 1];
          puVar4 = Xr_ind + sVar7;
          psVar5 = cols_use;
          while ((psVar5 < cols_use + ncols_use && (puVar4 < puVar1))) {
            uVar11 = *psVar5;
            uVar6 = *puVar4;
            if (uVar6 == uVar11) {
              *(double *)((long)buffer_sum_tot + ((long)psVar5 - (long)cols_use)) =
                   *(double *)((long)Xr + (long)puVar1 + (sVar7 * 8 - (long)puVar4)) +
                   *(double *)((long)buffer_sum_tot + ((long)psVar5 - (long)cols_use));
              psVar5 = psVar5 + 1;
              puVar4 = puVar4 + 1;
            }
            else if (uVar6 < uVar11 || uVar6 == uVar11) {
              puVar4 = std::
                       __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (puVar4,puVar1,psVar5);
            }
            else {
              psVar5 = std::
                       __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                                 (psVar5,cols_use + ncols_use,puVar4);
            }
          }
        }
      }
      goto LAB_00263bdf;
    }
    for (; uVar11 <= end; uVar11 = uVar11 + 1) {
      sVar10 = Xr_indptr[ix_arr[uVar11]];
      xpy1(Xr + sVar10,Xr_ind + sVar10,Xr_indptr[ix_arr[uVar11] + 1] - sVar10,buffer_sum_tot);
    }
    memset(buffer_sum_left,0,__n);
  }
  if (cVar3 == '\0') {
    dVar26 = -INFINITY;
    for (sVar10 = st; uVar11 = end - sVar10, sVar10 <= end && uVar11 != 0; sVar10 = sVar10 + 1) {
      sVar7 = ix_arr[sVar10];
      sVar9 = Xr_indptr[sVar7];
      xpy1(Xr + sVar9,Xr_ind + sVar9,Xr_indptr[sVar7 + 1] - sVar9,buffer_sum_left);
      if (x_uses_ix_arr) {
        bVar12 = NAN(x[sVar7]) || NAN(x[ix_arr[sVar10 + 1]]);
        bVar13 = x[sVar7] == x[ix_arr[sVar10 + 1]];
      }
      else {
        bVar12 = NAN(x[sVar10]) || NAN(x[sVar10 + 1]);
        bVar13 = x[sVar10] == x[sVar10 + 1];
      }
      if ((!bVar13) || (bVar12)) {
        uVar6 = (sVar10 - st) + 1;
        auVar16._0_8_ =
             ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar6 & 0xffffffff | 0x4330000000000000);
        auVar16._8_8_ =
             ((double)(uVar11 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar11 & 0xffffffff | 0x4330000000000000);
        dVar18 = 0.0;
        dVar19 = 0.0;
        for (sVar7 = 0; ncols != sVar7; sVar7 = sVar7 + 1) {
          dVar2 = buffer_sum_left[sVar7];
          auVar22._8_8_ = buffer_sum_tot[sVar7] - dVar2;
          auVar22._0_8_ = dVar2;
          auVar21 = divpd(auVar22,auVar16);
          dVar18 = dVar18 + auVar21._0_8_ * dVar2;
          dVar19 = dVar19 + auVar21._8_8_ * (buffer_sum_tot[sVar7] - dVar2);
        }
        if (dVar26 < dVar19 + dVar18) {
          *split_ix = sVar10;
          dVar26 = dVar19 + dVar18;
        }
      }
    }
  }
  else {
    dVar26 = -INFINITY;
    for (sVar10 = st; uVar11 = end - sVar10, sVar10 <= end && uVar11 != 0; sVar10 = sVar10 + 1) {
      sVar7 = Xr_indptr[ix_arr[sVar10]];
      if (sVar7 != Xr_indptr[ix_arr[sVar10] + 1]) {
        puVar1 = Xr_ind + Xr_indptr[ix_arr[sVar10] + 1];
        puVar4 = Xr_ind + sVar7;
        psVar5 = cols_use;
        while ((psVar5 < cols_use + ncols_use && (puVar4 < puVar1))) {
          if (*puVar4 == *psVar5) {
            *(double *)((long)buffer_sum_left + ((long)psVar5 - (long)cols_use)) =
                 *(double *)((long)Xr + (long)puVar1 + (sVar7 * 8 - (long)puVar4)) +
                 *(double *)((long)buffer_sum_left + ((long)psVar5 - (long)cols_use));
            psVar5 = psVar5 + 1;
            puVar4 = puVar4 + 1;
          }
          else if (*psVar5 < *puVar4) {
            psVar5 = std::
                     __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (psVar5,cols_use + ncols_use,puVar4);
          }
          else {
            puVar4 = std::
                     __lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                               (puVar4,puVar1,psVar5);
          }
        }
      }
      if (x_uses_ix_arr) {
        bVar12 = NAN(x[ix_arr[sVar10]]) || NAN(x[ix_arr[sVar10 + 1]]);
        bVar13 = x[ix_arr[sVar10]] == x[ix_arr[sVar10 + 1]];
      }
      else {
        bVar12 = NAN(x[sVar10]) || NAN(x[sVar10 + 1]);
        bVar13 = x[sVar10] == x[sVar10 + 1];
      }
      if ((!bVar13) || (bVar12)) {
        uVar6 = (sVar10 - st) + 1;
        auVar15._0_8_ =
             ((double)(uVar6 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar6 & 0xffffffff | 0x4330000000000000);
        auVar15._8_8_ =
             ((double)(uVar11 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar11 & 0xffffffff | 0x4330000000000000);
        dVar18 = 0.0;
        dVar19 = 0.0;
        for (sVar7 = 0; ncols_use != sVar7; sVar7 = sVar7 + 1) {
          dVar2 = buffer_sum_left[sVar7];
          auVar20._8_8_ = buffer_sum_tot[sVar7] - dVar2;
          auVar20._0_8_ = dVar2;
          auVar21 = divpd(auVar20,auVar15);
          dVar18 = dVar18 + auVar21._0_8_ * dVar2;
          dVar19 = dVar19 + auVar21._8_8_ * (buffer_sum_tot[sVar7] - dVar2);
        }
        if (dVar26 < dVar19 + dVar18) {
          *split_ix = sVar10;
          dVar26 = dVar19 + dVar18;
        }
      }
    }
  }
LAB_0026420f:
  dVar18 = -INFINITY;
  if (-INFINITY < dVar26) {
    sVar10 = *split_ix;
    if (x_uses_ix_arr) {
      sVar7 = ix_arr[sVar10 + 1];
      sVar10 = ix_arr[sVar10];
    }
    else {
      sVar7 = sVar10 + 1;
    }
    dVar18 = midpoint<float>(x[sVar10],x[sVar7]);
    *split_point = dVar18;
    lVar8 = (end - st) + 1;
    dVar18 = (double)((float)dVar26 / ((float)lVar8 + (float)(&DAT_003250d8)[lVar8 < 0]));
  }
  return dVar18;
}

Assistant:

double find_split_full_gain(real_t *restrict x, size_t st, size_t end, size_t *restrict ix_arr,
                            size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                            double *restrict X_row_major, size_t ncols,
                            double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                            double *restrict buffer_sum_left, double *restrict buffer_sum_tot,
                            size_t &restrict split_ix, double &restrict split_point,
                            bool x_uses_ix_arr)
{
    if (end <= st) return -HUGE_VAL;
    if (cols_use != NULL && ncols_use && (double)ncols_use / (double)ncols < 0.1)
        force_cols_use = true;

    memset(buffer_sum_tot, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (force_cols_use)
        {
            double *restrict ptr_row;
            for (size_t row = st; row <= end; row++)
            {
                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_tot[col] += ptr_row[cols_use[col]];
            }
        }

        else
        {
            for (size_t row = st; row <= end; row++)
                xpy1(X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
        }
    }

    else
    {
        if (force_cols_use)
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            for (size_t row = st; row <= end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) continue;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        buffer_sum_tot[std::distance(cols_use, curr_col)] += Xr_this[std::distance(curr_begin, row_end)];
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }
            }
        }

        else
        {
            size_t ptr_this;
            for (size_t row = st; row <= end; row++)
            {
                ptr_this = Xr_indptr[ix_arr[row]];
                xpy1(Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
            }
        }
    }

    double best_gain = -HUGE_VAL;
    double this_gain;
    double sl, sr;
    double dl, dr;
    double vleft, vright;
    memset(buffer_sum_left, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            for (size_t row = st; row < end; row++)
            {
                xpy1(X_row_major + ix_arr[row]*ncols, buffer_sum_left, ncols);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            double *restrict ptr_row;
            for (size_t row = st; row < end; row++)
            {
                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_left[col] += ptr_row[cols_use[col]];
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            for (size_t row = st; row < end; row++)
            {
                ptr_this = Xr_indptr[ix_arr[row]];
                xpy1(Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_left);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            for (size_t row = st; row < end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) goto skip_sum;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        buffer_sum_left[std::distance(cols_use, curr_col)] += Xr_this[std::distance(curr_begin, row_end)];
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }

                skip_sum:
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                dl = (double)(row-st+1);
                dr = (double)(end-row);
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / dl);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / dr);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    if (best_gain <= -HUGE_VAL) return best_gain;

    if (x_uses_ix_arr)
        split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    else
        split_point = midpoint(x[split_ix], x[split_ix+1]);
    return best_gain / (ldouble_safe)(end - st + 1);
}